

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O0

void LEARNER::generic_driver(vector<vw_*,_std::allocator<vw_*>_> *alls)

{
  bool bVar1;
  reference ppvVar2;
  learner<char,_char> *in_RDI;
  iterator it;
  vector<vw_*,_std::allocator<vw_*>_> *in_stack_ffffffffffffff88;
  vw *this;
  vector<vw_*,_std::allocator<vw_*>_> *this_00;
  __normal_iterator<vw_**,_std::vector<vw_*,_std::allocator<vw_*>_>_> local_40;
  vector<vw_*,_std::allocator<vw_*>_> *in_stack_ffffffffffffffc8;
  vw *in_stack_ffffffffffffffd0;
  vector<vw_*,_std::allocator<vw_*>_> *in_stack_ffffffffffffffd8;
  vector<vw_*,_std::allocator<vw_*>_> *in_stack_ffffffffffffffe0;
  __normal_iterator<vw_**,_std::vector<vw_*,_std::allocator<vw_*>_>_> local_10 [2];
  
  local_10[0]._M_current =
       (vw **)std::vector<vw_*,_std::allocator<vw_*>_>::begin(in_stack_ffffffffffffff88);
  ppvVar2 = __gnu_cxx::__normal_iterator<vw_**,_std::vector<vw_*,_std::allocator<vw_*>_>_>::
            operator*(local_10);
  this = *ppvVar2;
  this_00 = (vector<vw_*,_std::allocator<vw_*>_> *)&stack0xffffffffffffffd8;
  std::vector<vw_*,_std::allocator<vw_*>_>::vector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  generic_driver<std::vector<vw_*,_std::allocator<vw_*>_>,_&LEARNER::process_multiple>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<vw_*,_std::allocator<vw_*>_>::~vector(this_00);
  local_40._M_current =
       (vw **)std::vector<vw_*,_std::allocator<vw_*>_>::begin(in_stack_ffffffffffffff88);
  __gnu_cxx::__normal_iterator<vw_**,_std::vector<vw_*,_std::allocator<vw_*>_>_>::operator++
            ((__normal_iterator<vw_**,_std::vector<vw_*,_std::allocator<vw_*>_>_> *)this,
             (int)((ulong)in_RDI >> 0x20));
  while( true ) {
    std::vector<vw_*,_std::allocator<vw_*>_>::end(in_stack_ffffffffffffff88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<vw_**,_std::vector<vw_*,_std::allocator<vw_*>_>_> *)in_RDI
                       ,(__normal_iterator<vw_**,_std::vector<vw_*,_std::allocator<vw_*>_>_> *)
                        in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<vw_**,_std::vector<vw_*,_std::allocator<vw_*>_>_>::operator*
              (&local_40);
    learner<char,_char>::end_examples(in_RDI);
    __gnu_cxx::__normal_iterator<vw_**,_std::vector<vw_*,_std::allocator<vw_*>_>_>::operator++
              ((__normal_iterator<vw_**,_std::vector<vw_*,_std::allocator<vw_*>_>_> *)this,
               (int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void generic_driver(vector<vw*> alls)
{
  generic_driver<vector<vw*>, process_multiple>(**alls.begin(), alls);

  // skip first as it already called end_examples()
  auto it = alls.begin();
  for (it++; it != alls.end(); it++) (*it)->l->end_examples();
}